

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::Configurations::unsafeSetGlobally
          (Configurations *this,ConfigurationType configurationType,string *value,
          bool includeGlobalLevel)

{
  undefined7 in_register_00000009;
  ConfigurationType configurationType_local;
  EnumType lIndex;
  function<bool_()> local_58;
  anon_class_32_4_9afad3aa local_38;
  
  configurationType_local = configurationType;
  if ((int)CONCAT71(in_register_00000009,includeGlobalLevel) != 0) {
    unsafeSet(this,Global,configurationType,value);
  }
  lIndex = 2;
  local_38.configurationType = &configurationType_local;
  local_38.this = this;
  local_38.lIndex = &lIndex;
  local_38.value = value;
  std::function<bool()>::
  function<el::Configurations::unsafeSetGlobally(el::ConfigurationType,std::__cxx11::string_const&,bool)::_lambda()_1_,void>
            ((function<bool()> *)&local_58,&local_38);
  LevelHelper::forEachLevel(&lIndex,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  return;
}

Assistant:

void unsafeSetGlobally(ConfigurationType configurationType, const std::string& value, bool includeGlobalLevel) {
    if (includeGlobalLevel) {
      unsafeSet(Level::Global, configurationType, value);
    }
    base::type::EnumType lIndex = LevelHelper::kMinValid;
    LevelHelper::forEachLevel(&lIndex, [&](void) -> bool  {
      unsafeSet(LevelHelper::castFromInt(lIndex), configurationType, value);
      return false;  // Do not break lambda function yet as we need to set all levels regardless
    });
  }